

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qeasingcurve.cpp
# Opt level: O3

void __thiscall
QEasingCurve::addTCBSegment(QEasingCurve *this,QPointF *nextPoint,qreal t,qreal c,qreal b)

{
  double *pdVar1;
  double dVar2;
  TCBPoint *pTVar3;
  uint uVar4;
  double dVar5;
  double dVar6;
  bool bVar7;
  QEasingCurveFunction *pQVar8;
  ulong uVar9;
  long lVar10;
  long in_FS_OFFSET;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  undefined1 auVar18 [16];
  double dVar19;
  double dVar20;
  undefined1 auVar21 [16];
  double dVar22;
  double dVar23;
  TCBPoint local_98;
  QPointF local_68;
  QPointF local_58;
  QPointF local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar8 = this->d_ptr->config;
  if (pQVar8 == (QEasingCurveFunction *)0x0) {
    pQVar8 = curveToFunctionObject(this->d_ptr->type);
    this->d_ptr->config = pQVar8;
  }
  local_98._point.xp = nextPoint->xp;
  local_98._point.yp = nextPoint->yp;
  local_98._t = t;
  local_98._c = c;
  local_98._b = b;
  QtPrivate::QPodArrayOps<TCBPoint>::emplace<TCBPoint>
            ((QPodArrayOps<TCBPoint> *)&pQVar8->_tcbPoints,(pQVar8->_tcbPoints).d.size,&local_98);
  QList<TCBPoint>::end(&pQVar8->_tcbPoints);
  local_98._point.xp = 1.0;
  local_98._point.yp = 1.0;
  bVar7 = qFuzzyCompare(nextPoint,&local_98._point);
  if (bVar7) {
    pQVar8 = this->d_ptr->config;
    local_98._point.xp = 0.0;
    local_98._point.yp = 0.0;
    local_98._t = 0.0;
    uVar4 = (uint)(pQVar8->_tcbPoints).d.size;
    QList<QPointF>::reserve((QList<QPointF> *)&local_98,(long)(int)((uVar4 - 1) * 3));
    if (1 < (int)uVar4) {
      uVar9 = 1;
      lVar10 = 0x50;
      do {
        pTVar3 = (pQVar8->_tcbPoints).d.ptr;
        dVar11 = *(double *)((long)pTVar3 + lVar10 + -0x38);
        dVar2 = *(double *)((long)pTVar3 + lVar10 + -0x10);
        pdVar1 = (double *)((long)&pTVar3[-2]._point.xp + lVar10);
        dVar5 = *pdVar1;
        dVar6 = pdVar1[1];
        pdVar1 = (double *)((long)&pTVar3[-1]._point.xp + lVar10);
        local_48.xp = *pdVar1;
        local_48.yp = pdVar1[1];
        dVar12 = 0.0;
        dVar13 = 0.0;
        dVar23 = -1.0;
        dVar15 = 0.0;
        dVar16 = 0.0;
        if (1 < uVar9) {
          pdVar1 = (double *)((long)&pTVar3[-3]._point.xp + lVar10);
          dVar15 = *pdVar1;
          dVar16 = pdVar1[1];
          dVar23 = *(double *)((long)pTVar3 + lVar10 + -0x30);
        }
        dVar20 = 1.0;
        if (uVar9 < uVar4 - 1) {
          pdVar1 = (double *)((long)&(pTVar3->_point).xp + lVar10);
          dVar12 = *pdVar1;
          dVar13 = pdVar1[1];
          dVar20 = *(double *)((long)pTVar3 + lVar10 + -8);
        }
        dVar17 = (1.0 - *(double *)((long)pTVar3 + lVar10 + -0x40)) * 0.5;
        dVar14 = (dVar11 + 1.0) * (dVar23 + 1.0);
        dVar22 = (1.0 - dVar11) * (1.0 - dVar23);
        dVar23 = (1.0 - *(double *)((long)pTVar3 + lVar10 + -0x18)) * 0.5;
        dVar19 = (1.0 - dVar2) * (dVar20 + 1.0);
        dVar11 = (dVar2 + 1.0) * (1.0 - dVar20);
        auVar18._0_8_ =
             dVar17 * (dVar14 * (dVar5 - dVar15) + dVar22 * (local_48.xp - dVar5)) +
             dVar5 * (double)DAT_00583160;
        auVar18._8_8_ =
             dVar17 * (dVar14 * (dVar6 - dVar16) + dVar22 * (local_48.yp - dVar6)) +
             dVar6 * DAT_00583160._8_8_;
        local_58 = (QPointF)divpd(auVar18,_DAT_00583160);
        auVar21._0_8_ =
             local_48.xp * (double)DAT_00583160 -
             dVar23 * (dVar19 * (local_48.xp - dVar5) + dVar11 * (dVar12 - local_48.xp));
        auVar21._8_8_ =
             local_48.yp * DAT_00583160._8_8_ -
             dVar23 * (dVar19 * (local_48.yp - dVar6) + dVar11 * (dVar13 - local_48.yp));
        local_68 = (QPointF)divpd(auVar21,_DAT_00583160);
        QtPrivate::QPodArrayOps<QPointF>::emplace<QPointF_const&>
                  ((QPodArrayOps<QPointF> *)&local_98,(qsizetype)local_98._t,&local_58);
        QList<QPointF>::end((QList<QPointF> *)&local_98);
        QtPrivate::QPodArrayOps<QPointF>::emplace<QPointF_const&>
                  ((QPodArrayOps<QPointF> *)&local_98,(qsizetype)local_98._t,&local_68);
        QList<QPointF>::end((QList<QPointF> *)&local_98);
        QtPrivate::QPodArrayOps<QPointF>::emplace<QPointF_const&>
                  ((QPodArrayOps<QPointF> *)&local_98,(qsizetype)local_98._t,&local_48);
        QList<QPointF>::end((QList<QPointF> *)&local_98);
        uVar9 = uVar9 + 1;
        lVar10 = lVar10 + 0x28;
      } while ((uVar4 & 0x7fffffff) != uVar9);
    }
    QArrayDataPointer<QPointF>::operator=
              (&(this->d_ptr->config->_bezierCurves).d,(QArrayDataPointer<QPointF> *)&local_98);
    if ((QArrayData *)local_98._point.xp != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_98._point.xp)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_98._point.xp)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_98._point.xp)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_98._point.xp,0x10,0x10);
      }
    }
    QList<TCBPoint>::clear(&this->d_ptr->config->_tcbPoints);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QEasingCurve::addTCBSegment(const QPointF &nextPoint, qreal t, qreal c, qreal b)
{
    if (!d_ptr->config)
        d_ptr->config = curveToFunctionObject(d_ptr->type);

    d_ptr->config->_tcbPoints.append(TCBPoint(nextPoint, t, c, b));

    if (nextPoint == QPointF(1.0, 1.0)) {
        d_ptr->config->_bezierCurves = tcbToBezier(d_ptr->config->_tcbPoints);
        d_ptr->config->_tcbPoints.clear();
    }

}